

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::rfind
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_iterator pcVar5;
  unsigned_long *puVar6;
  const_iterator __first2;
  const_iterator __last2;
  char *pcVar7;
  size_type local_a8;
  const_iterator result;
  char *local_40;
  const_iterator last;
  size_type local_30;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  basic_string_view<char,_std::char_traits<char>_> v_local;
  
  v_local.data_ = (const_pointer)v.size_;
  this_local = (basic_string_view<char,_std::char_traits<char>_> *)v.data_;
  local_30 = pos;
  pos_local = (size_type)this;
  sVar3 = size(this);
  sVar4 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar3 < sVar4) {
    v_local.size_ = 0xffffffffffffffff;
  }
  else {
    bVar2 = empty((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar2) {
      last = (const_iterator)size(this);
      puVar6 = std::min<unsigned_long>((unsigned_long *)&last,&local_30);
      v_local.size_ = *puVar6;
    }
    else {
      pcVar5 = cbegin(this);
      sVar3 = size(this);
      sVar4 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      result = (const_iterator)(sVar3 - sVar4);
      puVar6 = std::min<unsigned_long>((unsigned_long *)&result,&local_30);
      uVar1 = *puVar6;
      sVar3 = size((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      local_40 = pcVar5 + sVar3 + uVar1;
      pcVar5 = cbegin(this);
      pcVar7 = local_40;
      __first2 = cbegin((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      __last2 = cend((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pcVar7 = std::find_end<char_const*,char_const*,bool(*)(char_const&,char_const&)>
                         (pcVar5,pcVar7,__first2,__last2,std::char_traits<char>::eq);
      if (pcVar7 == local_40) {
        local_a8 = 0xffffffffffffffff;
      }
      else {
        pcVar5 = cbegin(this);
        local_a8 = (long)pcVar7 - (long)pcVar5;
      }
      v_local.size_ = local_a8;
    }
  }
  return v_local.size_;
}

Assistant:

nssv_constexpr14 size_type rfind( basic_string_view v, size_type pos = npos ) const nssv_noexcept  // (1)
    {
        if ( size() < v.size() )
        {
            return npos;
        }

        if ( v.empty() )
        {
            return (std::min)( size(), pos );
        }

        const_iterator last   = cbegin() + (std::min)( size() - v.size(), pos ) + v.size();
        const_iterator result = std::find_end( cbegin(), last, v.cbegin(), v.cend(), Traits::eq );

        return result != last ? size_type( result - cbegin() ) : npos;
    }